

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmServerProtocol.cxx
# Opt level: O0

void __thiscall cmServerResponse::cmServerResponse(cmServerResponse *this,cmServerRequest *request)

{
  cmServerRequest *request_local;
  cmServerResponse *this_local;
  
  std::__cxx11::string::string((string *)this,(string *)request);
  std::__cxx11::string::string((string *)&this->Cookie,(string *)&request->Cookie);
  this->m_Payload = PAYLOAD_UNKNOWN;
  std::__cxx11::string::string((string *)&this->m_ErrorMessage);
  Json::Value::Value(&this->m_Data,nullValue);
  return;
}

Assistant:

cmServerResponse::cmServerResponse(const cmServerRequest& request)
  : Type(request.Type)
  , Cookie(request.Cookie)
{
}